

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fASTCDecompressionCases.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D::ASTCRenderer2D
          (ASTCRenderer2D *this,Context *context,CompressedTexFormat format,deUint32 randomSeed)

{
  int i;
  long lVar1;
  int local_40 [3];
  tcu local_34 [12];
  
  this->m_context = context;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,context->m_renderCtx,context->m_testCtx->m_log,GLSL_VERSION_300_ES,
             PRECISION_HIGHP);
  this->m_format = format;
  tcu::getBlockPixelSize(local_34,format);
  local_40[0] = 0;
  local_40[1] = 1;
  *(undefined8 *)(this->m_blockSize).m_data = 0;
  lVar1 = 0;
  do {
    (this->m_blockSize).m_data[lVar1] = *(int *)(local_34 + (long)local_40[lVar1] * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  this->m_astcSupport = ASTCSUPPORTLEVEL_NONE;
  lVar1 = 0;
  do {
    (this->m_colorScale).m_data[lVar1] = -1.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    (this->m_colorBias).m_data[lVar1] = -1.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  deRandom_init(&(this->m_rnd).m_rnd,randomSeed);
  this->m_initialized = false;
  return;
}

Assistant:

ASTCRenderer2D::ASTCRenderer2D (Context&			context,
								CompressedTexFormat	format,
								deUint32			randomSeed)
	: m_context			(context)
	, m_renderer		(context.getRenderContext(), context.getTestContext().getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
	, m_format			(format)
	, m_blockSize		(tcu::getBlockPixelSize(format).xy())
	, m_astcSupport		(ASTCSUPPORTLEVEL_NONE)
	, m_colorScale		(-1.0f)
	, m_colorBias		(-1.0f)
	, m_rnd				(randomSeed)
	, m_initialized		(false)
{
	DE_ASSERT(tcu::getBlockPixelSize(format).z() == 1);
}